

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

void mpz_lcm_ui(__mpz_struct *r,__mpz_struct *u,unsigned_long v)

{
  unsigned_long uVar1;
  __mpz_struct *u_00;
  ulong in_RDX;
  __mpz_struct *in_RSI;
  __mpz_struct *in_RDI;
  
  if ((in_RDX == 0) || (in_RSI->_mp_size == 0)) {
    in_RDI->_mp_size = 0;
  }
  else {
    uVar1 = mpz_gcd_ui((__mpz_struct *)v,in_RDI,(unsigned_long)in_RSI);
    u_00 = (__mpz_struct *)(in_RDX / uVar1);
    mpz_mul_ui((__mpz_struct *)v,in_RDI,(unsigned_long)in_RSI);
    mpz_abs(in_RSI,u_00);
  }
  return;
}

Assistant:

void
mpz_lcm_ui (mpz_t r, const mpz_t u, unsigned long v)
{
  if (v == 0 || u->_mp_size == 0)
    {
      r->_mp_size = 0;
      return;
    }

  v /= mpz_gcd_ui (NULL, u, v);
  mpz_mul_ui (r, u, v);

  mpz_abs (r, r);
}